

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O1

void __thiscall
SkylineBinPack::AddWasteMapArea
          (SkylineBinPack *this,int skylineNodeIndex,int width,int height,int y)

{
  uint *puVar1;
  Rect *pRVar2;
  int iVar3;
  int iVar4;
  SkylineNode *pSVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  Rect waste;
  Rect local_50;
  TArray<Rect,_Rect> *local_40;
  DisjointRectCollection *local_38;
  
  if (skylineNodeIndex < (int)(this->skyLine).Count) {
    lVar10 = (long)skylineNodeIndex;
    iVar3 = (this->skyLine).Array[lVar10].x;
    iVar8 = width + iVar3;
    local_38 = &this->disjointRects;
    local_40 = &(this->wasteMap).freeRectangles;
    lVar9 = lVar10 * 0xc + 8;
    do {
      pSVar5 = (this->skyLine).Array;
      iVar4 = *(int *)((long)pSVar5 + lVar9 + -8);
      if (iVar8 <= iVar4) {
        return;
      }
      iVar7 = *(int *)((long)&pSVar5->x + lVar9) + iVar4;
      if (iVar7 <= iVar3) {
        return;
      }
      if (y < *(int *)((long)pSVar5 + lVar9 + -4)) {
        __assert_fail("y >= skyLine[skylineNodeIndex].y",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0xbd,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
      }
      if (iVar8 < iVar7) {
        iVar7 = iVar8;
      }
      local_50.y = *(int *)((long)pSVar5 + lVar9 + -4);
      local_50.width = iVar7 - iVar4;
      local_50.height = y - local_50.y;
      local_50.x = iVar4;
      bVar6 = DisjointRectCollection::Disjoint(local_38,&local_50);
      if (!bVar6) {
        __assert_fail("disjointRects.Disjoint(waste)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0xc6,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
      }
      TArray<Rect,_Rect>::Grow(local_40,1);
      pRVar2 = (this->wasteMap).freeRectangles.Array + (this->wasteMap).freeRectangles.Count;
      pRVar2->x = local_50.x;
      pRVar2->y = local_50.y;
      pRVar2->width = local_50.width;
      pRVar2->height = local_50.height;
      puVar1 = &(this->wasteMap).freeRectangles.Count;
      *puVar1 = *puVar1 + 1;
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar10 < (int)(this->skyLine).Count);
  }
  return;
}

Assistant:

void SkylineBinPack::AddWasteMapArea(int skylineNodeIndex, int width, int height, int y)
{
	int wastedArea = 0;
	const int rectLeft = skyLine[skylineNodeIndex].x;
	const int rectRight = rectLeft + width;
	for(; skylineNodeIndex < (int)skyLine.Size() && skyLine[skylineNodeIndex].x < rectRight; ++skylineNodeIndex)
	{
		if (skyLine[skylineNodeIndex].x >= rectRight || skyLine[skylineNodeIndex].x + skyLine[skylineNodeIndex].width <= rectLeft)
			break;

		int leftSide = skyLine[skylineNodeIndex].x;
		int rightSide = MIN(rectRight, leftSide + skyLine[skylineNodeIndex].width);
		assert(y >= skyLine[skylineNodeIndex].y);

		Rect waste;
		waste.x = leftSide;
		waste.y = skyLine[skylineNodeIndex].y;
		waste.width = rightSide - leftSide;
		waste.height = y - skyLine[skylineNodeIndex].y;

#ifdef _DEBUG
		assert(disjointRects.Disjoint(waste));
#endif
		wasteMap.GetFreeRectangles().Push(waste);
	}
}